

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O2

void dirNexScreenUlaTimex(byte scrType)

{
  int iVar1;
  int32_t iVar2;
  ulong in_RAX;
  size_t sVar3;
  undefined7 in_register_00000039;
  size_t sVar4;
  ulong uStack_28;
  aint hiResColor;
  
  uStack_28 = in_RAX;
  if ((int)CONCAT71(in_register_00000039,scrType) == 8) {
    uStack_28 = in_RAX & 0xffffffff;
    iVar1 = ParseExpression(&lp,&hiResColor);
    if (iVar1 != 0) {
      if (7 < (uint)hiResColor) {
        Warning("[SAVENEX] value is not in 0..7 range",bp,W_PASS3);
      }
      nex.h.hiResColour = ((byte)hiResColor & 7) << 3;
    }
  }
  nex.h.screen = scrType;
  iVar2 = CDevice::GetMemoryOffset(Device,10,0);
  sVar4 = 0x1800;
  if (scrType == '\x02') {
    sVar4 = 0x1b00;
  }
  sVar3 = fwrite(Device->Memory + iVar2,1,sVar4,(FILE *)nex.f);
  if (sVar4 != sVar3) {
    Error("[SAVENEX] writing pixel data failed",(char *)0x0,FATAL);
  }
  if (scrType != '\x02') {
    sVar4 = fwrite(Device->Memory + (long)iVar2 + 0x2000,1,0x1800,(FILE *)nex.f);
    if (sVar4 != 0x1800) {
      Error("[SAVENEX] writing pixel data failed",(char *)0x0,FATAL);
    }
  }
  return;
}

Assistant:

static void dirNexScreenUlaTimex(byte scrType) {
// ;; SCREEN (SCR|SHC|SHR) [<hiResColour 0..7>]
	// parse argument (only HiRes screen type)
	if (SNexHeader::SCR_HIRES == scrType) {
		aint hiResColor = 0;
		if (ParseExpression(lp, hiResColor)) {
			if (hiResColor < 0 || 7 < hiResColor) Warning("[SAVENEX] value is not in 0..7 range", bp);
			nex.h.hiResColour = (hiResColor&7) << 3;
		}
	}
	// update header loading screen status
	nex.h.screen = scrType;
	// warn about invalid values
	size_t adrPixelData = Device->GetMemoryOffset(5*2, 0);
	size_t pixelDataSize = (SNexHeader::SCR_ULA == scrType) ? 0x1B00 : 0x1800;
	// write pixel data into file (from the default VRAM position of device)
	if (pixelDataSize != fwrite(Device->Memory + adrPixelData, 1, pixelDataSize, nex.f)) {
		Error("[SAVENEX] writing pixel data failed", NULL, FATAL);
	}
	if (SNexHeader::SCR_ULA == scrType) return;		//ULA is written in one go
	adrPixelData += 0x2000;							// address of second half of data
	// write [remaining] part of pixel data into file
	if (pixelDataSize != fwrite(Device->Memory + adrPixelData, 1, pixelDataSize, nex.f)) {
		Error("[SAVENEX] writing pixel data failed", NULL, FATAL);
	}
}